

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeLodControlTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeLodControlTestInstance *this)

{
  int iVar1;
  int iVar2;
  int height;
  int iVar3;
  deUint32 width;
  deUint32 height_00;
  int iVar4;
  TestTextureCube *pTVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference pvVar7;
  int *piVar8;
  TextureBinding *this_00;
  reference pvVar9;
  undefined4 extraout_var_00;
  TestContext *pTVar10;
  qpWatchDog *watchDog;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  allocator<char> local_949;
  string local_948;
  byte local_923;
  byte local_922;
  allocator<char> local_921;
  string local_920;
  undefined1 local_8fa;
  allocator<char> local_8f9;
  undefined1 local_8f8 [6];
  bool isOk;
  allocator<char> local_8d1;
  string local_8d0;
  LogImage local_8b0;
  allocator<char> local_819;
  string local_818;
  allocator<char> local_7f1;
  string local_7f0;
  LogImage local_7d0;
  allocator<char> local_739;
  string local_738;
  allocator<char> local_711;
  string local_710;
  LogImage local_6f0;
  allocator<char> local_659;
  string local_658;
  allocator<char> local_631;
  string local_630;
  LogImageSet local_610;
  MessageBuilder local_5d0;
  TextureCubeView local_450;
  PixelBufferAccess local_418;
  PixelBufferAccess local_3f0;
  PixelBufferAccess local_3c8;
  ConstPixelBufferAccess local_3a0;
  PixelBufferAccess local_378;
  ConstPixelBufferAccess local_350;
  TextureCubeView local_328;
  undefined1 local_2f0 [8];
  SurfaceAccess idealDst;
  CubeFace cubeFace_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int cellNdx_1;
  int local_2ac;
  Vector<int,_3> local_2a8;
  Vector<int,_4> local_29c;
  Vector<int,_4> local_28c;
  Vector<int,_4> local_27c;
  IVec4 local_26c;
  tcu local_25c [8];
  float afStack_254 [2];
  float local_24c;
  Sampler local_248;
  undefined1 local_20c [8];
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  int numFailedPixels;
  Surface errorMask;
  Surface referenceFrame;
  PixelFormat pixelFormat;
  undefined1 local_188 [8];
  IVec4 formatBitDepth;
  CubeFace cubeFace;
  int curH;
  int curW;
  int curY;
  int curX;
  int cellNdx;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  undefined1 local_138 [8];
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams refParams;
  Sampler sampler;
  int viewportHeight;
  int viewportWidth;
  TextureCube *refTexture;
  FilterMode magFilter;
  WrapMode wrapT;
  WrapMode wrapS;
  TextureCubeLodControlTestInstance *this_local;
  
  pTVar5 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->(&this->m_texture);
  iVar3 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x11])();
  width = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  height_00 = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  util::createSampler((Sampler *)&refParams.baseLevel,CLAMP_TO_EDGE,CLAMP_TO_EDGE,this->m_minFilter,
                      NEAREST);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TEXTURETYPE_CUBE,
             (Sampler *)&refParams.baseLevel,LODMODE_EXACT);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_138,width,height_00);
  refParams.maxLod = (float)deLog2Floor32(this->m_texSize);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
  computeGridLayout((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                    width,height_00);
  for (curY = 0;
      sVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX
                        ), curY < (int)sVar6; curY = curY + 1) {
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY);
    piVar8 = tcu::Vector<int,_4>::x(pvVar7);
    iVar4 = *piVar8;
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY);
    piVar8 = tcu::Vector<int,_4>::y(pvVar7);
    iVar1 = *piVar8;
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY);
    piVar8 = tcu::Vector<int,_4>::z(pvVar7);
    iVar2 = *piVar8;
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY);
    piVar8 = tcu::Vector<int,_4>::w(pvVar7);
    formatBitDepth.m_data[3] = *piVar8;
    formatBitDepth.m_data[2] = curY % 6;
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
               formatBitDepth.m_data[2]);
    (*(this->super_TestInstance)._vptr_TestInstance[3])
              (this,&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(ulong)(uint)curY);
    util::TextureRenderer::setViewport
              (&this->m_renderer,(float)iVar4,(float)iVar1,(float)iVar2,
               (float)formatBitDepth.m_data[3]);
    this_00 = util::TextureRenderer::getTextureBinding(&this->m_renderer,0);
    util::TextureBinding::updateTextureViewMipLevels
              (this_00,(deUint32)refParams.minLod,(deUint32)refParams.maxLod);
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
    util::TextureRenderer::renderQuad
              (&this->m_renderer,(Surface *)local_138,0,pvVar9,
               (ReferenceParams *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)local_188,(TextureFormat *)&pixelFormat.blueBits);
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_188,0);
  iVar4 = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_188,1);
  iVar1 = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_188,2);
  iVar2 = *piVar8;
  piVar8 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_188,3);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)&referenceFrame.m_pixels.m_cap,iVar4,iVar1,iVar2,*piVar8);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,width,height_00);
  tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,width,height_00);
  lookupPrec.colorThreshold.m_data[3] = 0.0;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)local_20c,RULE_VULKAN);
  util::createSampler(&local_248,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,NEAREST);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_248)
  ;
  refParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  glu::TextureTestUtil::getCompareMask
            ((TextureTestUtil *)&local_24c,(PixelFormat *)&referenceFrame.m_pixels.m_cap);
  lookupPrec.colorThreshold.m_data[2] = local_24c;
  glu::TextureTestUtil::getBitsVec
            ((TextureTestUtil *)&local_28c,(PixelFormat *)&referenceFrame.m_pixels.m_cap);
  tcu::operator-((tcu *)&local_27c,&local_28c,2);
  tcu::Vector<int,_4>::Vector(&local_29c,0);
  tcu::max<int,4>((tcu *)&local_26c,&local_27c,&local_29c);
  tcu::computeFixedPointThreshold(local_25c,&local_26c);
  lookupPrec.uvwBits.m_data._4_8_ = local_25c;
  lookupPrec.colorThreshold.m_data[0] = afStack_254[0];
  lookupPrec.colorThreshold.m_data[1] = afStack_254[1];
  tcu::Vector<int,_3>::Vector(&local_2a8,10);
  lookupPrec.coordBits.m_data[0] = local_2a8.m_data[2];
  lodPrec.derivateBits = local_2a8.m_data[0];
  lodPrec.lodBits = local_2a8.m_data[1];
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&curX_1,5,5,0);
  lookupPrec.coordBits.m_data[1] = curX_1;
  lookupPrec.coordBits.m_data[2] = cellNdx_1;
  lookupPrec.uvwBits.m_data[0] = local_2ac;
  local_20c._4_4_ = 10;
  lodPrec.rule = 6;
  for (curY_1 = 0;
      sVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX
                        ), curY_1 < (int)sVar6; curY_1 = curY_1 + 1) {
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar8 = tcu::Vector<int,_4>::x(pvVar7);
    iVar4 = *piVar8;
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar8 = tcu::Vector<int,_4>::y(pvVar7);
    iVar1 = *piVar8;
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar8 = tcu::Vector<int,_4>::z(pvVar7);
    iVar2 = *piVar8;
    pvVar7 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar8 = tcu::Vector<int,_4>::w(pvVar7);
    height = *piVar8;
    idealDst._28_4_ = curY_1 % 6;
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
               idealDst._28_4_);
    (*(this->super_TestInstance)._vptr_TestInstance[3])
              (this,&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,(ulong)(uint)curY_1);
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_2f0,(Surface *)&errorMask.m_pixels.m_cap,
               (PixelFormat *)&referenceFrame.m_pixels.m_cap,iVar4,iVar1,iVar2,height);
    tcu::TextureCube::operator_cast_to_TextureCubeView
              (&local_328,(TextureCube *)CONCAT44(extraout_var,iVar3));
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_2f0,&local_328,pvVar9,
               (ReferenceParams *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    tcu::Surface::getAccess(&local_378,(Surface *)local_138);
    tcu::getSubregion((PixelBufferAccess *)&local_350,&local_378,iVar4,iVar1,iVar2,height);
    tcu::Surface::getAccess(&local_3c8,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::getSubregion((PixelBufferAccess *)&local_3a0,&local_3c8,iVar4,iVar1,iVar2,height);
    tcu::Surface::getAccess(&local_418,(Surface *)&lookupPrec.colorMask);
    tcu::getSubregion(&local_3f0,&local_418,iVar4,iVar1,iVar2,height);
    pTVar5 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->(&this->m_texture);
    iVar4 = (*(pTVar5->super_TestTexture)._vptr_TestTexture[0x11])();
    tcu::TextureCube::operator_cast_to_TextureCubeView
              (&local_450,(TextureCube *)CONCAT44(extraout_var_00,iVar4));
    pvVar9 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
    pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
    watchDog = tcu::TestContext::getWatchDog(pTVar10);
    iVar4 = glu::TextureTestUtil::computeTextureLookupDiff
                      (&local_350,&local_3a0,&local_3f0,&local_450,pvVar9,
                       (ReferenceParams *)
                       &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_20c,watchDog);
    lookupPrec.colorThreshold.m_data[3] = (float)(iVar4 + (int)lookupPrec.colorThreshold.m_data[3]);
  }
  if (0 < (int)lookupPrec.colorThreshold.m_data[3]) {
    pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    tcu::TestLog::operator<<(&local_5d0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_5d0,(char (*) [41])"ERROR: Image verification failed, found ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)(lookupPrec.colorThreshold.m_data + 3))
    ;
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5d0);
  }
  pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_630,"Result",&local_631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"Verification result",&local_659);
  tcu::LogImageSet::LogImageSet(&local_610,&local_630,&local_658);
  pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_610);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_710,"Rendered",&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_738,"Rendered image",&local_739);
  tcu::LogImage::LogImage
            (&local_6f0,&local_710,&local_738,(Surface *)local_138,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar11,&local_6f0);
  tcu::LogImage::~LogImage(&local_6f0);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::__cxx11::string::~string((string *)&local_710);
  std::allocator<char>::~allocator(&local_711);
  tcu::LogImageSet::~LogImageSet(&local_610);
  std::__cxx11::string::~string((string *)&local_658);
  std::allocator<char>::~allocator(&local_659);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator(&local_631);
  if (0 < (int)lookupPrec.colorThreshold.m_data[3]) {
    pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7f0,"Reference",&local_7f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_818,"Ideal reference",&local_819);
    tcu::LogImage::LogImage
              (&local_7d0,&local_7f0,&local_818,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_7d0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8d0,"ErrorMask",&local_8d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_8f8,"Error mask",&local_8f9);
    tcu::LogImage::LogImage
              (&local_8b0,&local_8d0,(string *)local_8f8,(Surface *)&lookupPrec.colorMask,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar11,&local_8b0);
    tcu::LogImage::~LogImage(&local_8b0);
    std::__cxx11::string::~string((string *)local_8f8);
    std::allocator<char>::~allocator(&local_8f9);
    std::__cxx11::string::~string((string *)&local_8d0);
    std::allocator<char>::~allocator(&local_8d1);
    tcu::LogImage::~LogImage(&local_7d0);
    std::__cxx11::string::~string((string *)&local_818);
    std::allocator<char>::~allocator(&local_819);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
  }
  pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  local_8fa = lookupPrec.colorThreshold.m_data[3] == 0.0;
  local_922 = 0;
  local_923 = 0;
  if ((bool)local_8fa) {
    std::allocator<char>::allocator();
    local_922 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"pass",&local_921);
    local_923 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_920);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"fail",&local_949);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_948);
    std::__cxx11::string::~string((string *)&local_948);
    std::allocator<char>::~allocator(&local_949);
  }
  if ((local_923 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_920);
  }
  if ((local_922 & 1) != 0) {
    std::allocator<char>::~allocator(&local_921);
  }
  tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
  tcu::Surface::~Surface((Surface *)local_138);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeLodControlTestInstance::iterate (void)
{
	const tcu::Sampler::WrapMode	wrapS			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::WrapMode	wrapT			= Sampler::CLAMP_TO_EDGE;
	const tcu::Sampler::FilterMode	magFilter		= Sampler::NEAREST;

	const tcu::TextureCube&			refTexture		= m_texture->getTexture();
	const int						viewportWidth	= m_renderer.getRenderWidth();
	const int						viewportHeight	= m_renderer.getRenderHeight();

	tcu::Sampler					sampler			= util::createSampler(wrapS, wrapT, m_minFilter, magFilter);
	ReferenceParams					refParams		(TEXTURETYPE_CUBE, sampler);
	vector<float>					texCoord;
	tcu::Surface					renderedFrame	(viewportWidth, viewportHeight);

	refParams.maxLevel = deLog2Floor32(m_texSize);

	// Compute grid.
	vector<tcu::IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const int			curX		= gridLayout[cellNdx].x();
		const int			curY		= gridLayout[cellNdx].y();
		const int			curW		= gridLayout[cellNdx].z();
		const int			curH		= gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		computeQuadTexCoordCube(texCoord, cubeFace);
		getReferenceParams(refParams, cellNdx);

		// Render with GL.
		m_renderer.setViewport((float)curX, (float)curY, (float)curW, (float)curH);
		m_renderer.getTextureBinding(0)->updateTextureViewMipLevels(refParams.baseLevel, refParams.maxLevel);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(wrapS, wrapT, m_testParameters.minFilter, magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask				= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold			= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, IVec4(0)));
		lookupPrec.coordBits				= tcu::IVec3(10);
		lookupPrec.uvwBits					= tcu::IVec3(5,5,0);
		lodPrec.derivateBits				= 10;
		lodPrec.lodBits						= 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			computeQuadTexCoordCube(texCoord, cubeFace);
			getReferenceParams(refParams, cellNdx);

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, refTexture, &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec,  m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
			 m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;

		 m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											 << TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			 m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												 << TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		 m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}